

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O1

void duckdb_destroy_aggregate_function_set(duckdb_aggregate_function_set *set)

{
  duckdb_aggregate_function_set p_Var1;
  AggregateFunctionSet *aggregate_function_set;
  
  if ((set != (duckdb_aggregate_function_set *)0x0) &&
     (p_Var1 = *set, p_Var1 != (duckdb_aggregate_function_set)0x0)) {
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::~vector
              ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
               (p_Var1 + 0x20));
    if (*(duckdb_aggregate_function_set *)p_Var1 != p_Var1 + 0x10) {
      operator_delete(*(duckdb_aggregate_function_set *)p_Var1);
    }
    operator_delete(p_Var1);
    *set = (duckdb_aggregate_function_set)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_aggregate_function_set(duckdb_aggregate_function_set *set) {
	if (set && *set) {
		auto aggregate_function_set = reinterpret_cast<duckdb::AggregateFunctionSet *>(*set);
		delete aggregate_function_set;
		*set = nullptr;
	}
}